

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_Descriptor_Test::TestBody
          (ExtensionSetTest_Descriptor_Test *this)

{
  char *pcVar1;
  string_view name;
  string_view name_00;
  Metadata MVar2;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  AssertHelper local_28;
  internal local_20 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       GetExtensionReflection<proto2_unittest::TestAllExtensions,google::protobuf::internal::PrimitiveTypeTraits<int>,(unsigned_char)5,false,google::protobuf::DescriptorPool>
                 ((ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                   *)&proto2_unittest::optional_int32_extension);
  MVar2 = proto2_unittest::TestAllExtensions::GetMetadata
                    ((TestAllExtensions *)proto2_unittest::_TestAllExtensions_default_instance_);
  name._M_str = "optional_int32_extension";
  name._M_len = 0x18;
  local_28.data_ =
       (AssertHelperData *)FileDescriptor::FindExtensionByName((MVar2.descriptor)->file_,name);
  testing::internal::
  CmpHelperEQ<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*>
            (local_20,"GetExtensionReflection(unittest::optional_int32_extension)",
             "unittest::TestAllExtensions::descriptor()->file()->FindExtensionByName( \"optional_int32_extension\")"
             ,(FieldDescriptor **)&local_30,(FieldDescriptor **)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x5ae,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((FieldDescriptor *)local_30._M_head_impl != (FieldDescriptor *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       GetExtensionReflection<proto2_unittest::TestAllExtensions,google::protobuf::internal::PrimitiveTypeTraits<int>,(unsigned_char)5,false,google::protobuf::DescriptorPool>
                 ((ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                   *)&proto2_unittest::optional_int32_extension);
  local_28.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperNE<google::protobuf::FieldDescriptor_const*,decltype(nullptr)>
            (local_20,"GetExtensionReflection(unittest::optional_int32_extension)","nullptr",
             (FieldDescriptor **)&local_30,&local_28.data_);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x5b0,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((FieldDescriptor *)local_30._M_head_impl != (FieldDescriptor *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       GetExtensionReflection<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,(unsigned_char)11,false,google::protobuf::DescriptorPool>
                 ((ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false>
                   *)&pb::cpp);
  MVar2 = pb::CppFeatures::GetMetadata((CppFeatures *)pb::_CppFeatures_default_instance_);
  name_00._M_str = "cpp";
  name_00._M_len = 3;
  local_28.data_ =
       (AssertHelperData *)FileDescriptor::FindExtensionByName((MVar2.descriptor)->file_,name_00);
  testing::internal::
  CmpHelperEQ<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*>
            (local_20,"GetExtensionReflection(pb::cpp)",
             "pb::CppFeatures::descriptor()->file()->FindExtensionByName(\"cpp\")",
             (FieldDescriptor **)&local_30,(FieldDescriptor **)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x5b2,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((FieldDescriptor *)local_30._M_head_impl != (FieldDescriptor *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       GetExtensionReflection<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,(unsigned_char)11,false,google::protobuf::DescriptorPool>
                 ((ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false>
                   *)&pb::cpp);
  local_28.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperNE<google::protobuf::FieldDescriptor_const*,decltype(nullptr)>
            (local_20,"GetExtensionReflection(pb::cpp)","nullptr",(FieldDescriptor **)&local_30,
             &local_28.data_);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar1 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x5b3,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((FieldDescriptor *)local_30._M_head_impl != (FieldDescriptor *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  return;
}

Assistant:

TEST(ExtensionSetTest, Descriptor) {
  EXPECT_EQ(
      GetExtensionReflection(unittest::optional_int32_extension),
      unittest::TestAllExtensions::descriptor()->file()->FindExtensionByName(
          "optional_int32_extension"));
  EXPECT_NE(GetExtensionReflection(unittest::optional_int32_extension),
            nullptr);
  EXPECT_EQ(GetExtensionReflection(pb::cpp),
            pb::CppFeatures::descriptor()->file()->FindExtensionByName("cpp"));
  EXPECT_NE(GetExtensionReflection(pb::cpp), nullptr);
}